

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_want_write(nghttp2_session *session)

{
  int iVar1;
  nghttp2_session *in_RDI;
  undefined6 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffee;
  byte bVar2;
  uint local_4;
  
  if ((in_RDI->goaway_flags & 2) == 0) {
    bVar2 = 1;
    if ((((((in_RDI->aob).item == (nghttp2_outbound_item *)0x0) &&
          (bVar2 = 1, (in_RDI->ob_urgent).head == (nghttp2_outbound_item *)0x0)) &&
         (bVar2 = 1, (in_RDI->ob_reg).head == (nghttp2_outbound_item *)0x0)) &&
        (((iVar1 = nghttp2_pq_empty(&(in_RDI->root).obq), iVar1 != 0 &&
          (iVar1 = session_sched_empty((nghttp2_session *)
                                       CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffffee,
                                                               in_stack_ffffffffffffffe8))),
          iVar1 != 0)) || (bVar2 = 1, in_RDI->remote_window_size < 1)))) &&
       (bVar2 = 0, (in_RDI->ob_syn).head != (nghttp2_outbound_item *)0x0)) {
      iVar1 = session_is_outgoing_concurrent_streams_max(in_RDI);
      bVar2 = iVar1 != 0 ^ 0xff;
    }
    local_4 = (uint)(bVar2 & 1);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int nghttp2_session_want_write(nghttp2_session *session) {
  /* If these flag is set, we don't want to write any data. The
     application should drop the connection. */
  if (session->goaway_flags & NGHTTP2_GOAWAY_TERM_SENT) {
    return 0;
  }

  /*
   * Unless termination GOAWAY is sent or received, we want to write
   * frames if there is pending ones. If pending frame is request/push
   * response HEADERS and concurrent stream limit is reached, we don't
   * want to write them.
   */
  return session->aob.item || nghttp2_outbound_queue_top(&session->ob_urgent) ||
         nghttp2_outbound_queue_top(&session->ob_reg) ||
         ((!nghttp2_pq_empty(&session->root.obq) ||
           !session_sched_empty(session)) &&
          session->remote_window_size > 0) ||
         (nghttp2_outbound_queue_top(&session->ob_syn) &&
          !session_is_outgoing_concurrent_streams_max(session));
}